

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_fusestrref(ASMState *as,IRIns *ir,RegSet allow)

{
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  Reg RVar4;
  
  (as->mrm).base = 0x80;
  (as->mrm).idx = 0x80;
  (as->mrm).scale = '\0';
  (as->mrm).ofs = 0x10;
  uVar1 = (ir->field_0).op1;
  if ((short)uVar1 < 0) {
    uVar3 = (uint)*(char *)((long)as->ir + (ulong)uVar1 * 8 + 6);
    if ((int)uVar3 < 0) {
      uVar3 = ra_allocref(as,(uint)uVar1,allow);
    }
    bVar2 = (byte)uVar3 & 0x1f;
    as->weakset = as->weakset & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
    allow = allow & ~(1 << (uVar3 & 0x1f));
    (as->mrm).base = (byte)uVar3;
  }
  else {
    (as->mrm).ofs = as->ir[uVar1].field_1.op12 + 0x10;
  }
  uVar1 = (ir->field_0).op2;
  if ((short)uVar1 < 0) {
    bVar2 = *(byte *)((long)as->ir + (ulong)uVar1 * 8 + 6);
    if ((char)bVar2 < '\0') {
      RVar4 = ra_allocref(as,(uint)uVar1,allow);
      bVar2 = (byte)RVar4;
    }
    as->weakset = as->weakset & (-2 << (bVar2 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar2 & 0x1f));
    (as->mrm).idx = bVar2;
  }
  else {
    (as->mrm).ofs = (as->mrm).ofs + as->ir[uVar1].field_1.op12;
  }
  return;
}

Assistant:

static void asm_fusestrref(ASMState *as, IRIns *ir, RegSet allow)
{
  IRIns *irr;
  lj_assertA(ir->o == IR_STRREF, "bad IR op %d", ir->o);
  as->mrm.base = as->mrm.idx = RID_NONE;
  as->mrm.scale = XM_SCALE1;
  as->mrm.ofs = sizeof(GCstr);
  if (!LJ_GC64 && irref_isk(ir->op1)) {
    as->mrm.ofs += IR(ir->op1)->i;
  } else {
    Reg r = ra_alloc1(as, ir->op1, allow);
    rset_clear(allow, r);
    as->mrm.base = (uint8_t)r;
  }
  irr = IR(ir->op2);
  if (irref_isk(ir->op2)) {
    as->mrm.ofs += irr->i;
  } else {
    Reg r;
    /* Fuse a constant add into the offset, e.g. string.sub(s, i+10). */
    if (!LJ_64 &&  /* Has bad effects with negative index on x64. */
	mayfuse(as, ir->op2) && irr->o == IR_ADD && irref_isk(irr->op2)) {
      as->mrm.ofs += IR(irr->op2)->i;
      r = ra_alloc1(as, irr->op1, allow);
    } else {
      r = ra_alloc1(as, ir->op2, allow);
    }
    if (as->mrm.base == RID_NONE)
      as->mrm.base = (uint8_t)r;
    else
      as->mrm.idx = (uint8_t)r;
  }
}